

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoopThread::threadFunc(EventLoopThread *this)

{
  MutexLock *mutex;
  undefined1 local_d8 [8];
  EventLoop loop;
  MutexLockGuard lock;
  
  EventLoop::EventLoop((EventLoop *)local_d8);
  if ((this->m_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    loop.m_pendingFunctors.
    super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_d8;
    (*(this->m_callback)._M_invoker)
              ((_Any_data *)&this->m_callback,
               (EventLoop **)
               &loop.m_pendingFunctors.
                super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  mutex = &this->m_mutex;
  loop.m_pendingFunctors.
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)mutex;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  this->m_loop = (EventLoop *)local_d8;
  sz_cond_notify(&(this->m_cond).m_cond);
  *(undefined4 *)
   ((long)&loop.m_pendingFunctors.
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage[1].super__Function_base._M_functor + 8)
       = 0;
  sz_mutex_unlock((sz_mutex_t *)
                  loop.m_pendingFunctors.
                  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  EventLoop::loop((EventLoop *)local_d8);
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  this->m_loop = (EventLoop *)0x0;
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  EventLoop::~EventLoop((EventLoop *)local_d8);
  return;
}

Assistant:

void EventLoopThread::threadFunc()
{
	EventLoop loop;

	// 循环前的回调任务
	if (m_callback)
	{
		m_callback(&loop);
	}

	// 创建好了，给EventLoopThread对象通知一哈
	{
		MutexLockGuard lock(m_mutex);
		m_loop = &loop;
		m_cond.notify();
	}

	loop.loop();
	// 结束
	MutexLockGuard lock(m_mutex);
	m_loop = nullptr;
}